

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O2

void util::ThreadRename(string *name)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&local_38,"b-",name);
  prctl(0xf,local_38._M_dataplus._M_p,0,0,0);
  std::__cxx11::string::~string((string *)&local_38);
  SetInternalName(name);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void util::ThreadRename(const std::string& name)
{
    SetThreadName(("b-" + name).c_str());
    SetInternalName(name);
}